

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectMultipleCallsWithParameters_Test::
~TEST_MockParameterTest_expectMultipleCallsWithParameters_Test
          (TEST_MockParameterTest_expectMultipleCallsWithParameters_Test *this)

{
  TEST_MockParameterTest_expectMultipleCallsWithParameters_Test *this_local;
  
  ~TEST_MockParameterTest_expectMultipleCallsWithParameters_Test(this);
  operator_delete(this,8);
  return;
}

Assistant:

TEST(MockParameterTest, expectMultipleCallsWithParameters)
{
    int expected_int = -7;
    unsigned int expected_uint = 7;

    mock().expectNCalls(2, "boo").withParameter("double", 1.0).withParameter("int", expected_int).
        withParameter("string", "string").withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);

    mock().checkExpectations();
}